

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node.cpp
# Opt level: O1

void __thiscall despot::VNode::PrintPolicyTree(VNode *this,int depth,ostream *os)

{
  double dVar1;
  int iVar2;
  pointer ppQVar3;
  QNode *pQVar4;
  ostream *poVar5;
  long *plVar6;
  _Rb_tree_node_base *p_Var7;
  mapped_type *ppVVar8;
  long lVar9;
  long lVar10;
  QNode *pQVar11;
  _Self __tmp;
  ulong uVar12;
  vector<unsigned_long,_std::allocator<unsigned_long>_> labels;
  unsigned_long *local_98;
  unsigned_long *puStack_90;
  unsigned_long *local_88;
  ostream *local_80;
  string local_78;
  string local_58;
  map<unsigned_long,_despot::VNode_*,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_despot::VNode_*>_>_>
  *local_38;
  
  if ((depth == -1) || (this->depth_ <= depth)) {
    ppQVar3 = (this->children_).
              super__Vector_base<despot::QNode_*,_std::allocator<despot::QNode_*>_>._M_impl.
              super__Vector_impl_data._M_start;
    lVar9 = (long)(this->children_).
                  super__Vector_base<despot::QNode_*,_std::allocator<despot::QNode_*>_>._M_impl.
                  super__Vector_impl_data._M_finish - (long)ppQVar3;
    local_80 = os;
    if (lVar9 == 0) {
      iVar2 = (this->default_move_).action;
      poVar5 = std::ostream::_M_insert<void_const*>(os);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,"-a=",3);
      plVar6 = (long *)std::ostream::operator<<(poVar5,iVar2);
      std::ios::widen((char)*(undefined8 *)(*plVar6 + -0x18) + (char)plVar6);
      std::ostream::put((char)plVar6);
      std::ostream::flush();
      return;
    }
    lVar9 = lVar9 >> 3;
    lVar10 = 0;
    pQVar11 = (QNode *)0x0;
    do {
      pQVar4 = ppQVar3[lVar10];
      if ((pQVar11 == (QNode *)0x0) ||
         (dVar1 = pQVar4->lower_bound_,
         pQVar11->lower_bound_ <= dVar1 && dVar1 != pQVar11->lower_bound_)) {
        pQVar11 = pQVar4;
      }
      lVar10 = lVar10 + 1;
    } while (lVar9 + (ulong)(lVar9 == 0) != lVar10);
    poVar5 = std::ostream::_M_insert<void_const*>(os);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,"-a=",3);
    plVar6 = (long *)std::ostream::operator<<(poVar5,pQVar11->edge_);
    std::ios::widen((char)*(undefined8 *)(*plVar6 + -0x18) + (char)plVar6);
    std::ostream::put((char)plVar6);
    std::ostream::flush();
    local_98 = (unsigned_long *)0x0;
    puStack_90 = (unsigned_long *)0x0;
    local_88 = (unsigned_long *)0x0;
    for (p_Var7 = *(_Base_ptr *)((long)&(pQVar11->children_)._M_t._M_impl + 0x18);
        p_Var7 != (_Rb_tree_node_base *)((long)&(pQVar11->children_)._M_t._M_impl + 8U);
        p_Var7 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var7)) {
      if (puStack_90 == local_88) {
        std::vector<unsigned_long,std::allocator<unsigned_long>>::
        _M_realloc_insert<unsigned_long_const&>
                  ((vector<unsigned_long,std::allocator<unsigned_long>> *)&local_98,
                   (iterator)puStack_90,(unsigned_long *)(p_Var7 + 1));
      }
      else {
        *puStack_90 = *(unsigned_long *)(p_Var7 + 1);
        puStack_90 = puStack_90 + 1;
      }
    }
    if (puStack_90 != local_98) {
      local_38 = &pQVar11->children_;
      uVar12 = 0;
      do {
        if ((depth == -1) || (this->depth_ < depth)) {
          local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"|   ","");
          repeat(&local_78,&local_58,this->depth_);
          poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                             (local_80,local_78._M_dataplus._M_p,local_78._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(poVar5,"| o=",4);
          poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
          std::__ostream_insert<char,std::char_traits<char>>(poVar5,": ",2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_78._M_dataplus._M_p != &local_78.field_2) {
            operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_58._M_dataplus._M_p != &local_58.field_2) {
            operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
          }
          local_78._M_dataplus._M_p = (pointer)local_98[uVar12];
          ppVVar8 = std::
                    map<unsigned_long,_despot::VNode_*,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_despot::VNode_*>_>_>
                    ::operator[](local_38,(key_type *)&local_78);
          PrintPolicyTree(*ppVVar8,depth,local_80);
        }
        uVar12 = uVar12 + 1;
      } while (uVar12 < (ulong)((long)puStack_90 - (long)local_98 >> 3));
    }
    if (local_98 != (unsigned_long *)0x0) {
      operator_delete(local_98,(long)local_88 - (long)local_98);
    }
  }
  return;
}

Assistant:

void VNode::PrintPolicyTree(int depth, ostream& os) {
	if (depth != -1 && this->depth() > depth)
		return;

	vector<QNode*>& qnodes = children();
	if (qnodes.size() == 0) {
		ACT_TYPE astar = this->default_move().action;
		os << this << "-a=" << astar << endl;
	} else {
		QNode* qstar = NULL;
		for (int a = 0; a < qnodes.size(); a++) {
			QNode* qnode = qnodes[a];
			if (qstar == NULL || qnode->lower_bound() > qstar->lower_bound()) {
				qstar = qnode;
			}
		}

		os << this << "-a=" << qstar->edge() << endl;

		vector<OBS_TYPE> labels;
		map<OBS_TYPE, VNode*>& vnodes = qstar->children();
		for (map<OBS_TYPE, VNode*>::iterator it = vnodes.begin();
			it != vnodes.end(); it++) {
			labels.push_back(it->first);
		}

		for (int i = 0; i < labels.size(); i++) {
			if (depth == -1 || this->depth() + 1 <= depth) {
				os << repeat("|   ", this->depth()) << "| o=" << labels[i]
					<< ": ";
				qstar->Child(labels[i])->PrintPolicyTree(depth, os);
			}
		}
	}
}